

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O3

int mbedtls_ctr_drbg_self_test(int verbose)

{
  int iVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uchar buf [16];
  mbedtls_ctr_drbg_context ctx;
  uchar local_188;
  char cStack_187;
  char cStack_186;
  char cStack_185;
  char cStack_184;
  char cStack_183;
  char cStack_182;
  char cStack_181;
  char cStack_180;
  char cStack_17f;
  char cStack_17e;
  char cStack_17d;
  char cStack_17c;
  char cStack_17b;
  char cStack_17a;
  char cStack_179;
  mbedtls_ctr_drbg_context local_178;
  
  memset(&local_178,0,0x158);
  if (verbose == 0) {
    test_offset = 0;
    iVar1 = mbedtls_ctr_drbg_seed_entropy_len
                      (&local_178,ctr_drbg_self_test_entropy,entropy_source_pr,nonce_pers_pr,0x10,
                       0x20);
    if (iVar1 != 0) {
      return 1;
    }
    local_178.prediction_resistance = 1;
    iVar1 = mbedtls_ctr_drbg_random_with_add(&local_178,&local_188,0x10,(uchar *)0x0,0);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = mbedtls_ctr_drbg_random_with_add(&local_178,&local_188,0x10,(uchar *)0x0,0);
    if (iVar1 != 0) {
      return 1;
    }
    auVar4[0] = -(local_188 == '4');
    auVar4[1] = -(cStack_187 == '\x01');
    auVar4[2] = -(cStack_186 == '\x16');
    auVar4[3] = -(cStack_185 == 'V');
    auVar4[4] = -(cStack_184 == -0x4c);
    auVar4[5] = -(cStack_183 == ')');
    auVar4[6] = -(cStack_182 == '\0');
    auVar4[7] = -(cStack_181 == -0x71);
    auVar4[8] = -(cStack_180 == '5');
    auVar4[9] = -(cStack_17f == 'c');
    auVar4[10] = -(cStack_17e == -0x14);
    auVar4[0xb] = -(cStack_17d == -0x4b);
    auVar4[0xc] = -(cStack_17c == -0xe);
    auVar4[0xd] = -(cStack_17b == 'Y');
    auVar4[0xe] = -(cStack_17a == '\a');
    auVar4[0xf] = -(cStack_179 == '#');
    if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe | (ushort)(auVar4[0xf] >> 7) << 0xf)
        != 0xffff) {
      return 1;
    }
LAB_00125d39:
    mbedtls_aes_free(&local_178.aes_ctx);
    lVar2 = 0;
    do {
      local_178.counter[lVar2] = '\0';
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x158);
    if (verbose != 0) {
      puts("passed");
      printf("  CTR_DRBG (PR = FALSE): ");
    }
    memset(&local_178,0,0x158);
    test_offset = 0;
    iVar1 = mbedtls_ctr_drbg_seed_entropy_len
                      (&local_178,ctr_drbg_self_test_entropy,entropy_source_nopr,nonce_pers_nopr,
                       0x10,0x20);
    if (((iVar1 == 0) &&
        (iVar1 = mbedtls_ctr_drbg_random_with_add(&local_178,&local_188,0x10,(uchar *)0x0,0),
        iVar1 == 0)) &&
       ((iVar1 = mbedtls_ctr_drbg_reseed(&local_178,(uchar *)0x0,0), iVar1 == 0 &&
        ((iVar1 = mbedtls_ctr_drbg_random_with_add(&local_178,&local_188,0x10,(uchar *)0x0,0),
         iVar1 == 0 &&
         (auVar5[0] = -(local_188 == 0xa0), auVar5[1] = -(cStack_187 == 'T'),
         auVar5[2] = -(cStack_186 == '0'), auVar5[3] = -(cStack_185 == '='),
         auVar5[4] = -(cStack_184 == -0x76), auVar5[5] = -(cStack_183 == '~'),
         auVar5[6] = -(cStack_182 == -0x57), auVar5[7] = -(cStack_181 == -0x78),
         auVar5[8] = -(cStack_180 == -99), auVar5[9] = -(cStack_17f == -0x70),
         auVar5[10] = -(cStack_17e == '>'), auVar5[0xb] = -(cStack_17d == '\a'),
         auVar5[0xc] = -(cStack_17c == '|'), auVar5[0xd] = -(cStack_17b == 'o'),
         auVar5[0xe] = -(cStack_17a == '!'), auVar5[0xf] = -(cStack_179 == -0x71),
         (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe | (ushort)(auVar5[0xf] >> 7) << 0xf)
         == 0xffff)))))) {
      mbedtls_aes_free(&local_178.aes_ctx);
      lVar2 = 0;
      do {
        local_178.counter[lVar2] = '\0';
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x158);
      if (verbose == 0) {
        return 0;
      }
      puts("passed");
      putchar(10);
      return 0;
    }
    if (verbose != 0) {
      puts("failed");
    }
  }
  else {
    printf("  CTR_DRBG (PR = TRUE) : ");
    test_offset = 0;
    iVar1 = mbedtls_ctr_drbg_seed_entropy_len
                      (&local_178,ctr_drbg_self_test_entropy,entropy_source_pr,nonce_pers_pr,0x10,
                       0x20);
    if (iVar1 == 0) {
      local_178.prediction_resistance = 1;
      iVar1 = mbedtls_ctr_drbg_random_with_add(&local_178,&local_188,0x10,(uchar *)0x0,0);
      if (((iVar1 == 0) &&
          (iVar1 = mbedtls_ctr_drbg_random_with_add(&local_178,&local_188,0x10,(uchar *)0x0,0),
          iVar1 == 0)) &&
         (auVar3[0] = -(local_188 == '4'), auVar3[1] = -(cStack_187 == '\x01'),
         auVar3[2] = -(cStack_186 == '\x16'), auVar3[3] = -(cStack_185 == 'V'),
         auVar3[4] = -(cStack_184 == -0x4c), auVar3[5] = -(cStack_183 == ')'),
         auVar3[6] = -(cStack_182 == '\0'), auVar3[7] = -(cStack_181 == -0x71),
         auVar3[8] = -(cStack_180 == '5'), auVar3[9] = -(cStack_17f == 'c'),
         auVar3[10] = -(cStack_17e == -0x14), auVar3[0xb] = -(cStack_17d == -0x4b),
         auVar3[0xc] = -(cStack_17c == -0xe), auVar3[0xd] = -(cStack_17b == 'Y'),
         auVar3[0xe] = -(cStack_17a == '\a'), auVar3[0xf] = -(cStack_179 == '#'),
         (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe | (ushort)(auVar3[0xf] >> 7) << 0xf)
         == 0xffff)) goto LAB_00125d39;
    }
    puts("failed");
  }
  return 1;
}

Assistant:

int mbedtls_ctr_drbg_self_test( int verbose )
{
    mbedtls_ctr_drbg_context ctx;
    unsigned char buf[16];

    mbedtls_ctr_drbg_init( &ctx );

    /*
     * Based on a NIST CTR_DRBG test vector (PR = True)
     */
    if( verbose != 0 )
        mbedtls_printf( "  CTR_DRBG (PR = TRUE) : " );

    test_offset = 0;
    CHK( mbedtls_ctr_drbg_seed_entropy_len( &ctx, ctr_drbg_self_test_entropy,
                                (void *) entropy_source_pr, nonce_pers_pr, 16, 32 ) );
    mbedtls_ctr_drbg_set_prediction_resistance( &ctx, MBEDTLS_CTR_DRBG_PR_ON );
    CHK( mbedtls_ctr_drbg_random( &ctx, buf, MBEDTLS_CTR_DRBG_BLOCKSIZE ) );
    CHK( mbedtls_ctr_drbg_random( &ctx, buf, MBEDTLS_CTR_DRBG_BLOCKSIZE ) );
    CHK( memcmp( buf, result_pr, MBEDTLS_CTR_DRBG_BLOCKSIZE ) );

    mbedtls_ctr_drbg_free( &ctx );

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    /*
     * Based on a NIST CTR_DRBG test vector (PR = FALSE)
     */
    if( verbose != 0 )
        mbedtls_printf( "  CTR_DRBG (PR = FALSE): " );

    mbedtls_ctr_drbg_init( &ctx );

    test_offset = 0;
    CHK( mbedtls_ctr_drbg_seed_entropy_len( &ctx, ctr_drbg_self_test_entropy,
                            (void *) entropy_source_nopr, nonce_pers_nopr, 16, 32 ) );
    CHK( mbedtls_ctr_drbg_random( &ctx, buf, 16 ) );
    CHK( mbedtls_ctr_drbg_reseed( &ctx, NULL, 0 ) );
    CHK( mbedtls_ctr_drbg_random( &ctx, buf, 16 ) );
    CHK( memcmp( buf, result_nopr, 16 ) );

    mbedtls_ctr_drbg_free( &ctx );

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    if( verbose != 0 )
            mbedtls_printf( "\n" );

    return( 0 );
}